

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O0

Method webfront::http::Request::getMethodFromString(string_view text)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  char *pcVar2;
  char *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  size_t index;
  array<const_char_*,_9UL> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *__n;
  char *pcVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  
  __n = (char *)0x0;
  while( true ) {
    pcVar3 = __n;
    pcVar2 = (char *)std::array<const_char_*,_9UL>::size(&methodNames);
    if (pcVar2 <= __n) {
      return Undefined;
    }
    pbVar4 = in_RDI;
    pcVar2 = in_RSI;
    std::array<const_char_*,_9UL>::operator[](in_stack_ffffffffffffffc0,(size_type)__n);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffffc8);
    __x._M_str = pcVar2;
    __x._M_len = (size_t)pbVar4;
    __y._M_str = pcVar3;
    __y._M_len = (size_t)in_RSI;
    bVar1 = ::std::operator==(__x,__y);
    if (bVar1) break;
    __n = pcVar3 + 1;
    in_RDI = pbVar4;
    in_RSI = pcVar2;
  }
  return (Method)pcVar3;
}

Assistant:

[[nodiscard]] static Method getMethodFromString(std::string_view text) {
        for (size_t index = 0; index < methodNames.size(); ++index)
            if (methodNames[index] == text) return static_cast<Method>(index);
        return Method::Undefined;
    }